

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

char * Rml::LegalVariableName(String *name)

{
  char cVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  reference pcVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_190;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  String *__range1;
  undefined1 local_170 [7];
  char first;
  undefined1 local_150 [8];
  String name_lower;
  allocator<char> local_128;
  allocator<char> local_127;
  allocator<char> local_126;
  allocator<char> local_125 [20];
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  String *name_local;
  
  local_18 = (undefined1  [8])name;
  if (LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&LegalVariableName(std::__cxx11::string_const&)::
                                 reserved_names_abi_cxx11_);
    if (iVar3 != 0) {
      name_lower.field_2._M_local_buf[0xd] = '\x01';
      local_110 = &local_108;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"it",&local_111);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>(local_e8,"it_index",local_125);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>(local_c8,"ev",&local_126);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>(local_a8,"true",&local_127);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>(local_88,"false",&local_128);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (local_68,"size",(allocator<char> *)(name_lower.field_2._M_local_buf + 0xf));
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (local_48,"literal",(allocator<char> *)(name_lower.field_2._M_local_buf + 0xe));
      name_lower.field_2._M_local_buf[0xd] = '\0';
      local_28 = &local_108;
      local_20 = 7;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(name_lower.field_2._M_local_buf + 0xb));
      init._M_len = local_20;
      init._M_array = local_28;
      itlib::
      flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::flat_set(&LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_,init,
                 (key_compare *)(name_lower.field_2._M_local_buf + 0xc),
                 (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(name_lower.field_2._M_local_buf + 0xb));
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(name_lower.field_2._M_local_buf + 0xb));
      local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
      do {
        local_218 = local_218 + -1;
        ::std::__cxx11::string::~string((string *)local_218);
      } while (local_218 != &local_108);
      ::std::allocator<char>::~allocator((allocator<char> *)(name_lower.field_2._M_local_buf + 0xe))
      ;
      ::std::allocator<char>::~allocator((allocator<char> *)(name_lower.field_2._M_local_buf + 0xf))
      ;
      ::std::allocator<char>::~allocator(&local_128);
      ::std::allocator<char>::~allocator(&local_127);
      ::std::allocator<char>::~allocator(&local_126);
      ::std::allocator<char>::~allocator(local_125);
      ::std::allocator<char>::~allocator(&local_111);
      __cxa_atexit(itlib::
                   flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~flat_set,
                   &LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&LegalVariableName(std::__cxx11::string_const&)::reserved_names_abi_cxx11_
                         );
    }
  }
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    ::std::__cxx11::string::string((string *)local_170,(string *)local_18);
    StringUtilities::ToLower((String *)local_150,(String *)local_170);
    ::std::__cxx11::string::~string((string *)local_170);
    pcVar5 = (char *)::std::__cxx11::string::front();
    if ((*pcVar5 < 'a') || ('z' < *pcVar5)) {
      name_local = (String *)anon_var_dwarf_7813c;
    }
    else {
      __end1._M_current = (char *)::std::__cxx11::string::begin();
      _Stack_190._M_current = (char *)::std::__cxx11::string::end();
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe70);
        if (!bVar2) break;
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
        cVar1 = *pcVar6;
        if (((cVar1 != '_') && ((cVar1 < 'a' || ('z' < cVar1)))) && ((cVar1 < '0' || ('9' < cVar1)))
           ) {
          name_local = (String *)anon_var_dwarf_78146;
          goto LAB_004f9a34;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      sVar7 = itlib::
              flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::count<std::__cxx11::string>
                        ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&LegalVariableName(std::__cxx11::string_const&)::
                             reserved_names_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150);
      if (sVar7 == 1) {
        name_local = (String *)anon_var_dwarf_7815c;
      }
      else {
        name_local = (String *)0x0;
      }
    }
LAB_004f9a34:
    ::std::__cxx11::string::~string((string *)local_150);
  }
  else {
    name_local = (String *)anon_var_dwarf_78126;
  }
  return (char *)name_local;
}

Assistant:

static const char* LegalVariableName(const String& name)
{
	static SmallUnorderedSet<String> reserved_names{"it", "it_index", "ev", "true", "false", "size", "literal"};

	if (name.empty())
		return "Name cannot be empty.";

	const String name_lower = StringUtilities::ToLower(name);

	const char first = name_lower.front();
	if (!(first >= 'a' && first <= 'z'))
		return "First character must be 'a-z' or 'A-Z'.";

	for (const char c : name_lower)
	{
		if (!(c == '_' || (c >= 'a' && c <= 'z') || (c >= '0' && c <= '9')))
			return "Name must strictly contain characters a-z, A-Z, 0-9 and under_score.";
	}

	if (reserved_names.count(name_lower) == 1)
		return "Name is reserved.";

	return nullptr;
}